

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::SSARewriter::ReplacePhiUsersWith
          (SSARewriter *this,PhiCandidate *phi_to_remove,uint32_t repl_id)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  reference puVar5;
  PhiCandidate *this_00;
  IRContext *this_01;
  BasicBlock *this_02;
  reference puVar6;
  reference ppVar7;
  pair<const_unsigned_int,_unsigned_int> *it;
  iterator __end5;
  iterator __begin5;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *__range5;
  uint32_t *arg;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  BasicBlock *bb;
  PhiCandidate *user_phi;
  const_iterator cStack_38;
  uint32_t user_id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  uint32_t repl_id_local;
  PhiCandidate *phi_to_remove_local;
  SSARewriter *this_local;
  
  pvVar4 = PhiCandidate::users(phi_to_remove);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar4);
  cStack_38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar4);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8), bVar1) {
    puVar5 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    uVar3 = *puVar5;
    this_00 = GetPhiCandidate(this,uVar3);
    this_01 = Pass::context(&this->pass_->super_Pass);
    this_02 = IRContext::get_instr_block(this_01,uVar3);
    if (this_00 == (PhiCandidate *)0x0) {
      uVar2 = BasicBlock::id(this_02);
      if (uVar2 == uVar3) {
        uVar3 = PhiCandidate::var_id(phi_to_remove);
        WriteVariable(this,uVar3,this_02,repl_id);
      }
      else {
        __end5 = std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::begin(&this->load_replacement_);
        it = (pair<const_unsigned_int,_unsigned_int> *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::end(&this->load_replacement_);
        while (bVar1 = std::__detail::operator!=
                                 (&__end5.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ,(_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                    *)&it), bVar1) {
          ppVar7 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                   operator*(&__end5);
          uVar3 = ppVar7->second;
          uVar2 = PhiCandidate::result_id(phi_to_remove);
          if (uVar3 == uVar2) {
            ppVar7->second = repl_id;
          }
          std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
          operator++(&__end5);
        }
      }
    }
    else {
      pvVar4 = PhiCandidate::phi_args(this_00);
      __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar4);
      arg = (uint32_t *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)&arg), bVar1) {
        puVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end4);
        uVar3 = *puVar6;
        uVar2 = PhiCandidate::result_id(phi_to_remove);
        if (uVar3 == uVar2) {
          *puVar6 = repl_id;
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end4);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void SSARewriter::ReplacePhiUsersWith(const PhiCandidate& phi_to_remove,
                                      uint32_t repl_id) {
  for (uint32_t user_id : phi_to_remove.users()) {
    PhiCandidate* user_phi = GetPhiCandidate(user_id);
    BasicBlock* bb = pass_->context()->get_instr_block(user_id);
    if (user_phi) {
      // If the user is a Phi candidate, replace all arguments that refer to
      // |phi_to_remove.result_id()| with |repl_id|.
      for (uint32_t& arg : user_phi->phi_args()) {
        if (arg == phi_to_remove.result_id()) {
          arg = repl_id;
        }
      }
    } else if (bb->id() == user_id) {
      // The phi candidate is the definition of the variable at basic block
      // |bb|.  We must change this to the replacement.
      WriteVariable(phi_to_remove.var_id(), bb, repl_id);
    } else {
      // For regular loads, traverse the |load_replacement_| table looking for
      // instances of |phi_to_remove|.
      for (auto& it : load_replacement_) {
        if (it.second == phi_to_remove.result_id()) {
          it.second = repl_id;
        }
      }
    }
  }
}